

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,const_iterator begin,const_iterator end,Style style)

{
  Twine local_90;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  
  while ((begin.Path.Data != end.Path.Data || (begin.Position != end.Position))) {
    Twine::Twine(&local_48,&begin.Component);
    Twine::Twine(&local_60,"");
    Twine::Twine(&local_78,"");
    Twine::Twine(&local_90,"");
    append(path,style,&local_48,&local_60,&local_78,&local_90);
    const_iterator::operator++(&begin);
  }
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, const_iterator begin,
            const_iterator end, Style style) {
  for (; begin != end; ++begin)
    path::append(path, style, *begin);
}